

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::Parser::ParseVector
          (Parser *this,Type *vector_type,uoffset_t *ovalue,FieldDef *field,size_t fieldn)

{
  long lVar1;
  FieldDef *pFVar2;
  uchar *end;
  ulong alignment;
  char cVar3;
  Offset<void> OVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  Value *pVVar10;
  uint *puVar11;
  size_t *psVar12;
  anon_class_8_1_ba1d59bf comparator;
  ulong uVar13;
  StructDef *in_R9;
  bool bVar14;
  anon_class_16_2_e19d79f7 comparator_00;
  anon_class_8_1_6663148b in_stack_fffffffffffffe88;
  undefined1 local_16a [2];
  FlatBufferBuilderImpl<false> *local_168;
  ulong local_160;
  Type local_158;
  size_t align;
  string local_118 [48];
  FieldDef *local_e8;
  uoffset_t *local_e0;
  vector<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>,std::allocator<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>>
  *local_d8;
  StructDef *local_d0;
  Value val;
  undefined1 local_80 [72];
  pointer local_38;
  
  local_158.base_type = ovalue[1];
  local_158.fixed_length = (uint16_t)ovalue[6];
  local_158.element = BASE_TYPE_NONE;
  local_158.struct_def._0_2_ = (undefined2)*(undefined8 *)(ovalue + 2);
  local_158.struct_def._2_6_ = (undefined6)((ulong)*(undefined8 *)(ovalue + 2) >> 0x10);
  local_158.enum_def._0_2_ = (undefined2)*(undefined8 *)(ovalue + 4);
  local_158.enum_def._2_6_ = (undefined6)((ulong)*(undefined8 *)(ovalue + 4) >> 0x10);
  local_168 = (FlatBufferBuilderImpl<false> *)fieldn;
  local_e8 = field;
  local_e0 = ovalue;
  local_d0 = in_R9;
  Expect((Parser *)local_16a,(int)vector_type);
  local_16a[1] = true;
  if ((bool)local_16a[0] == false) {
    CheckedError::~CheckedError((CheckedError *)local_16a);
    local_d8 = (vector<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>,std::allocator<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>>
                *)&vector_type[0x39].enum_def;
    uVar13 = 0;
    do {
      local_160 = uVar13;
      if (((byte)(uVar13 == 0 | *(byte *)((long)&vector_type[0x1f].struct_def + 2) ^ 1) == 1) &&
         (*(int *)&vector_type->field_0x1c == 0x5d)) {
LAB_0010c932:
        Next((Parser *)local_16a);
        local_16a[1] = true;
        cVar3 = local_16a[0];
        if ((bool)local_16a[0] == false) {
          CheckedError::~CheckedError((CheckedError *)local_16a);
          local_16a[0] = false;
          local_16a[1] = false;
          cVar3 = '\0';
        }
        goto LAB_0010c96b;
      }
      Value::Value(&val);
      val.type.element = local_158.element;
      val.type.base_type = local_158.base_type;
      val.type.fixed_length = local_158.fixed_length;
      val.type.enum_def._2_6_ = local_158.enum_def._2_6_;
      val.type.enum_def._0_2_ = local_158.enum_def._0_2_;
      val.type.struct_def._0_2_ = local_158.struct_def._0_2_;
      val.type.struct_def._2_4_ = local_158.struct_def._2_4_;
      val.type.struct_def._6_1_ = local_158.struct_def._6_1_;
      val.type.struct_def._7_1_ = local_158.struct_def._7_1_;
      fieldn = (size_t)local_d0;
      ParseAnyValue((Parser *)local_16a,(Value *)vector_type,(FieldDef *)&val,(size_t)local_168,
                    local_d0,0,SUB81(local_160,0));
      local_16a[1] = true;
      if ((bool)local_16a[0] == false) {
        CheckedError::~CheckedError((CheckedError *)local_16a);
        Value::Value((Value *)local_80,&val);
        local_38 = (pointer)0x0;
        std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>::
        pair<flatbuffers::Value,_std::nullptr_t,_true>
                  ((pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *)&align,
                   (pair<flatbuffers::Value,_std::nullptr_t> *)local_80);
        std::
        vector<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>,std::allocator<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>>
        ::emplace_back<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>
                  (local_d8,(pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *)&align);
        std::__cxx11::string::~string(local_118);
        std::__cxx11::string::~string((string *)(local_80 + 0x20));
        local_16a[0] = false;
        local_16a[1] = false;
      }
      std::__cxx11::string::~string((string *)&val.constant);
      local_16a[1] = true;
      uVar13 = local_160;
      cVar3 = local_16a[0];
      if ((bool)local_16a[0] != false) goto LAB_0010c96b;
      CheckedError::~CheckedError((CheckedError *)local_16a);
      if (*(int *)&vector_type->field_0x1c == 0x5d) {
        uVar13 = local_160 + 1;
        goto LAB_0010c932;
      }
      ParseComma((Parser *)local_16a);
      local_16a[1] = true;
      if ((bool)local_16a[0] != false) goto LAB_0010c963;
      CheckedError::~CheckedError((CheckedError *)local_16a);
      uVar13 = local_160 + 1;
    } while( true );
  }
  uVar13 = 0;
  cVar3 = local_16a[0];
LAB_0010c96b:
  *(char *)&(this->super_ParserState).prev_cursor_ = cVar3;
  local_16a[1] = true;
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (cVar3 == '\0') {
    CheckedError::~CheckedError((CheckedError *)this);
    sVar7 = InlineAlignment(&local_158);
    sVar8 = InlineSize(&local_158);
    sVar9 = InlineAlignment(&local_158);
    local_160 = (sVar8 * uVar13) / sVar9;
    sVar8 = InlineAlignment(&local_158);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&align,"force_align",(allocator<char> *)local_80);
    pVVar10 = SymbolTable<flatbuffers::Value>::Lookup
                        ((SymbolTable<flatbuffers::Value> *)&local_168->length_of_64_bit_region_,
                         (string *)&align);
    std::__cxx11::string::~string((string *)&align);
    if (pVVar10 != (Value *)0x0) {
      fieldn = (size_t)&align;
      ParseAlignAttribute(this,(string *)vector_type,(size_t)&pVVar10->constant,(size_t *)0x1);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d02b;
      CheckedError::~CheckedError((CheckedError *)this);
      alignment = CONCAT44(align._4_4_,CONCAT22(align._2_2_,CONCAT11(align._1_1_,(uchar)align)));
      if (1 < alignment) {
        FlatBufferBuilderImpl<false>::ForceVectorAlignment
                  ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,local_160,sVar8,
                   alignment);
      }
    }
    local_168 = (FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def;
    FlatBufferBuilderImpl<false>::StartVector<flatbuffers::Offset,unsigned_int>
              (local_168,local_160,sVar8,sVar7);
    local_160 = uVar13;
    while( true ) {
      bVar14 = uVar13 == 0;
      uVar13 = uVar13 - 1;
      if (bVar14) break;
      lVar1 = *(long *)&vector_type[0x39].fixed_length;
      switch(*(undefined4 *)(lVar1 + -0x50)) {
      case 0:
        anon_unknown_0::atot<unsigned_char>
                  ((anon_unknown_0 *)this,*(char **)(lVar1 + -0x30),(Parser *)vector_type,
                   (uchar *)&align);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d02b;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                  (local_168,(uchar)align);
        break;
      case 1:
        anon_unknown_0::atot<unsigned_char>
                  ((anon_unknown_0 *)this,*(char **)(lVar1 + -0x30),(Parser *)vector_type,
                   (uchar *)&align);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d02b;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                  (local_168,(uchar)align);
        break;
      case 2:
        anon_unknown_0::atot<unsigned_char>
                  ((anon_unknown_0 *)this,*(char **)(lVar1 + -0x30),(Parser *)vector_type,
                   (uchar *)&align);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d02b;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                  (local_168,(uchar)align);
        break;
      case 3:
        anon_unknown_0::atot<signed_char>
                  ((anon_unknown_0 *)this,*(char **)(lVar1 + -0x30),(Parser *)vector_type,
                   (char *)&align);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d02b;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<signed_char,unsigned_int>(local_168,(uchar)align);
        break;
      case 4:
        anon_unknown_0::atot<unsigned_char>
                  ((anon_unknown_0 *)this,*(char **)(lVar1 + -0x30),(Parser *)vector_type,
                   (uchar *)&align);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d02b;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                  (local_168,(uchar)align);
        break;
      case 5:
        anon_unknown_0::atot<short>
                  ((anon_unknown_0 *)this,*(char **)(lVar1 + -0x30),(Parser *)vector_type,
                   (short *)&align);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d02b;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<short,unsigned_int>
                  (local_168,CONCAT11(align._1_1_,(uchar)align));
        break;
      case 6:
        anon_unknown_0::atot<unsigned_short>
                  ((anon_unknown_0 *)this,*(char **)(lVar1 + -0x30),(Parser *)vector_type,
                   (unsigned_short *)&align);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d02b;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<unsigned_short,unsigned_int>
                  (local_168,CONCAT11(align._1_1_,(uchar)align));
        break;
      case 7:
        anon_unknown_0::atot<int>
                  ((anon_unknown_0 *)this,*(char **)(lVar1 + -0x30),(Parser *)vector_type,
                   (int *)&align);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d02b;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                  (local_168,CONCAT22(align._2_2_,CONCAT11(align._1_1_,(uchar)align)));
        break;
      case 8:
        anon_unknown_0::atot<unsigned_int>
                  ((anon_unknown_0 *)this,*(char **)(lVar1 + -0x30),(Parser *)vector_type,
                   (uint *)&align);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d02b;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                  (local_168,CONCAT22(align._2_2_,CONCAT11(align._1_1_,(uchar)align)));
        break;
      case 9:
        anon_unknown_0::atot<long>
                  ((anon_unknown_0 *)this,*(char **)(lVar1 + -0x30),(Parser *)vector_type,
                   (long *)&align);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d02b;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<long,unsigned_int>
                  (local_168,
                   CONCAT44(align._4_4_,CONCAT22(align._2_2_,CONCAT11(align._1_1_,(uchar)align))));
        break;
      case 10:
        anon_unknown_0::atot<unsigned_long>
                  ((anon_unknown_0 *)this,*(char **)(lVar1 + -0x30),(Parser *)vector_type,&align);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d02b;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<unsigned_long,unsigned_int>
                  (local_168,
                   CONCAT44(align._4_4_,CONCAT22(align._2_2_,CONCAT11(align._1_1_,(uchar)align))));
        break;
      case 0xb:
        anon_unknown_0::atot<float>
                  ((anon_unknown_0 *)this,*(char **)(lVar1 + -0x30),(Parser *)vector_type,
                   (float *)&align);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d02b;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<float,unsigned_int>
                  (local_168,(float)CONCAT22(align._2_2_,CONCAT11(align._1_1_,(uchar)align)));
        break;
      case 0xc:
        anon_unknown_0::atot<double>
                  ((anon_unknown_0 *)this,*(char **)(lVar1 + -0x30),(Parser *)vector_type,
                   (double *)&align);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d02b;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<double,unsigned_int>
                  (local_168,
                   (double)CONCAT44(align._4_4_,
                                    CONCAT22(align._2_2_,CONCAT11(align._1_1_,(uchar)align))));
        break;
      case 0xd:
        OVar4.o = atoi(*(char **)(lVar1 + -0x30));
        *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<void,flatbuffers::Offset>(local_168,OVar4);
        break;
      case 0xe:
        OVar4.o = atoi(*(char **)(lVar1 + -0x30));
        *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<void,flatbuffers::Offset>(local_168,OVar4);
        break;
      case 0xf:
        if ((*(StructDef **)(lVar1 + -0x48))->fixed == true) {
          SerializeStruct((Parser *)vector_type,*(StructDef **)(lVar1 + -0x48),
                          (Value *)(lVar1 + -0x50));
        }
        else {
          OVar4.o = atoi(*(char **)(lVar1 + -0x30));
          *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
          CheckedError::~CheckedError((CheckedError *)this);
          FlatBufferBuilderImpl<false>::PushElement<void,flatbuffers::Offset>(local_168,OVar4);
        }
        break;
      case 0x10:
        OVar4.o = atoi(*(char **)(lVar1 + -0x30));
        *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<void,flatbuffers::Offset>(local_168,OVar4);
        break;
      case 0x11:
        anon_unknown_0::atot<int>
                  ((anon_unknown_0 *)this,*(char **)(lVar1 + -0x30),(Parser *)vector_type,
                   (int *)&align);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d02b;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                  (local_168,CONCAT22(align._2_2_,CONCAT11(align._1_1_,(uchar)align)));
        break;
      case 0x12:
        iVar5 = atoi(*(char **)(lVar1 + -0x30));
        *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
        CheckedError::~CheckedError((CheckedError *)this);
        FlatBufferBuilderImpl<false>::PushElement<void,flatbuffers::Offset64>
                  (local_168,(Offset64<void>)(long)iVar5);
      }
      std::
      vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
      ::pop_back((vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                  *)&vector_type[0x39].enum_def);
    }
    vector_type[0x10].enum_def =
         (EnumDef *)
         ((long)vector_type[0x10].enum_def + (ulong)*(uint *)&vector_type[0x10].fixed_length * -8);
    *(undefined4 *)&vector_type[0x10].fixed_length = 0;
    *(undefined2 *)&vector_type[0x10].field_0x1c = 0;
    if (*local_e0 == 0x12) {
      uVar6 = FlatBufferBuilderImpl<false>::EndVector<unsigned_long,unsigned_int>
                        (local_168,local_160);
    }
    else {
      uVar6 = FlatBufferBuilderImpl<false>::EndVector<unsigned_int,unsigned_int>
                        (local_168,local_160);
    }
    *(uint *)&(local_e8->super_Definition).name._M_dataplus._M_p = uVar6;
    if ((local_158.base_type == BASE_TYPE_STRUCT) &&
       (lVar1 = CONCAT62(local_158.struct_def._2_6_,local_158.struct_def._0_2_),
       *(char *)(lVar1 + 0x113) == '\x01')) {
      psVar12 = *(size_t **)(lVar1 + 0xf8);
      do {
        if (psVar12 == *(size_t **)(lVar1 + 0x100)) {
          __assert_fail("key",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                        ,0x6ea,
                        "CheckedError flatbuffers::Parser::ParseVector(const Type &, uoffset_t *, FieldDef *, size_t)"
                       );
        }
        sVar7 = *psVar12;
        psVar12 = psVar12 + 1;
      } while (*(char *)(sVar7 + 0x111) == '\0');
      if (*(char *)(lVar1 + 0x110) == '\x01') {
        pFVar2 = *(FieldDef **)(lVar1 + 0x120);
        uVar6 = *(uint *)(sVar7 + 0x108);
        puVar11 = (uint *)vector_downward<unsigned_int>::data(&local_168->buf_);
        end = *(uchar **)(CONCAT62(local_158.struct_def._2_6_,local_158.struct_def._0_2_) + 0x120);
        comparator_00.key = pFVar2;
        comparator_00._0_8_ = sVar7;
        (anonymous_namespace)::
        SimpleQsort<unsigned_char,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__1,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__2>
                  ((_anonymous_namespace_ *)(puVar11 + 1),
                   (uchar *)((long)puVar11 + (ulong)*puVar11 * (long)end + 4),end,(ulong)uVar6,
                   comparator_00,in_stack_fffffffffffffe88);
      }
      else {
        puVar11 = (uint *)vector_downward<unsigned_int>::data(&local_168->buf_);
        comparator.key._4_4_ = 0;
        comparator.key._0_4_ = *puVar11;
        if (*(int *)(sVar7 + 200) == 0xd) {
          (anonymous_namespace)::
          SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__3,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
                    ((Offset<flatbuffers::Table> *)(puVar11 + 1),
                     (Offset<flatbuffers::Table> *)
                     (puVar11 +
                     (long)((long)&((comparator.key)->super_Definition).name._M_dataplus._M_p + 1)),
                     sVar7,comparator,
                     (_func_void_Offset<flatbuffers::Table>_ptr_Offset<flatbuffers::Table>_ptr *)
                     fieldn);
        }
        else {
          (anonymous_namespace)::
          SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__4,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
                    ((Offset<flatbuffers::Table> *)(puVar11 + 1),
                     (Offset<flatbuffers::Table> *)
                     (puVar11 +
                     (long)((long)&((comparator.key)->super_Definition).name._M_dataplus._M_p + 1)),
                     sVar7,comparator,
                     (_func_void_Offset<flatbuffers::Table>_ptr_Offset<flatbuffers::Table>_ptr *)
                     fieldn);
        }
      }
    }
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
LAB_0010d02b:
  CheckedError::~CheckedError((CheckedError *)local_16a);
  return SUB82(this,0);
LAB_0010c963:
  uVar13 = local_160 + 1;
  cVar3 = local_16a[0];
  goto LAB_0010c96b;
}

Assistant:

CheckedError Parser::ParseVector(const Type &vector_type, uoffset_t *ovalue,
                                 FieldDef *field, size_t fieldn) {
  Type type = vector_type.VectorType();
  size_t count = 0;
  auto err = ParseVectorDelimiters(count, [&](size_t &) -> CheckedError {
    Value val;
    val.type = type;
    ECHECK(ParseAnyValue(val, field, fieldn, nullptr, count, true));
    field_stack_.push_back(std::make_pair(val, nullptr));
    return NoError();
  });
  ECHECK(err);

  const size_t alignment = InlineAlignment(type);
  const size_t len = count * InlineSize(type) / InlineAlignment(type);
  const size_t elemsize = InlineAlignment(type);
  const auto force_align = field->attributes.Lookup("force_align");
  if (force_align) {
    size_t align;
    ECHECK(ParseAlignAttribute(force_align->constant, 1, &align));
    if (align > 1) { builder_.ForceVectorAlignment(len, elemsize, align); }
  }

  // TODO Fix using element alignment as size (`elemsize`)!
  if (vector_type.base_type == BASE_TYPE_VECTOR64) {
    // TODO(derekbailey): this requires a 64-bit builder.
    // builder_.StartVector<Offset64, uoffset64_t>(len, elemsize, alignment);
    builder_.StartVector(len, elemsize, alignment);
  } else {
    builder_.StartVector(len, elemsize, alignment);
  }
  for (size_t i = 0; i < count; i++) {
    // start at the back, since we're building the data backwards.
    auto &val = field_stack_.back().first;
    switch (val.type.base_type) {
      // clang-format off
      #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE,...) \
        case BASE_TYPE_ ## ENUM: \
          if (IsStruct(val.type)) SerializeStruct(*val.type.struct_def, val); \
          else { \
             CTYPE elem; \
             ECHECK(atot(val.constant.c_str(), *this, &elem)); \
             builder_.PushElement(elem); \
          } \
          break;
        FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
      #undef FLATBUFFERS_TD
      // clang-format on
    }
    field_stack_.pop_back();
  }

  builder_.ClearOffsets();
  if (vector_type.base_type == BASE_TYPE_VECTOR64) {
    *ovalue = builder_.EndVector<uoffset64_t>(count);
  } else {
    *ovalue = builder_.EndVector(count);
  }

  if (type.base_type == BASE_TYPE_STRUCT && type.struct_def->has_key) {
    // We should sort this vector. Find the key first.
    const FieldDef *key = nullptr;
    for (auto it = type.struct_def->fields.vec.begin();
         it != type.struct_def->fields.vec.end(); ++it) {
      if ((*it)->key) {
        key = (*it);
        break;
      }
    }
    FLATBUFFERS_ASSERT(key);
    // Now sort it.
    // We can't use std::sort because for structs the size is not known at
    // compile time, and for tables our iterators dereference offsets, so can't
    // be used to swap elements.
    // And we can't use C qsort either, since that would force use to use
    // globals, making parsing thread-unsafe.
    // So for now, we use SimpleQsort above.
    // TODO: replace with something better, preferably not recursive.

    if (type.struct_def->fixed) {
      const voffset_t offset = key->value.offset;
      const size_t struct_size = type.struct_def->bytesize;
      auto v =
          reinterpret_cast<VectorOfAny *>(builder_.GetCurrentBufferPointer());
      SimpleQsort<uint8_t>(
          v->Data(), v->Data() + v->size() * type.struct_def->bytesize,
          type.struct_def->bytesize,
          [offset, key](const uint8_t *a, const uint8_t *b) -> bool {
            return CompareSerializedScalars(a + offset, b + offset, *key);
          },
          [struct_size](uint8_t *a, uint8_t *b) {
            // FIXME: faster?
            for (size_t i = 0; i < struct_size; i++) { std::swap(a[i], b[i]); }
          });
    } else {
      auto v = reinterpret_cast<Vector<Offset<Table>> *>(
          builder_.GetCurrentBufferPointer());
      // Here also can't use std::sort. We do have an iterator type for it,
      // but it is non-standard as it will dereference the offsets, and thus
      // can't be used to swap elements.
      if (key->value.type.base_type == BASE_TYPE_STRING) {
        SimpleQsort<Offset<Table>>(
            v->data(), v->data() + v->size(), 1,
            [key](const Offset<Table> *_a, const Offset<Table> *_b) -> bool {
              return CompareTablesByStringKey(_a, _b, *key);
            },
            SwapSerializedTables);
      } else {
        SimpleQsort<Offset<Table>>(
            v->data(), v->data() + v->size(), 1,
            [key](const Offset<Table> *_a, const Offset<Table> *_b) -> bool {
              return CompareTablesByScalarKey(_a, _b, *key);
            },
            SwapSerializedTables);
      }
    }
  }
  return NoError();
}